

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O0

CURLcode Curl_rand_alnum(Curl_easy *data,uchar *rnd,size_t num)

{
  CURLcode CVar1;
  uint local_34 [2];
  uint r;
  int alnumspace;
  CURLcode result;
  size_t num_local;
  uchar *rnd_local;
  Curl_easy *data_local;
  
  local_34[1] = 0x3e;
  _alnumspace = num - 1;
  num_local = (size_t)rnd;
  rnd_local = (uchar *)data;
  do {
    if (_alnumspace == 0) {
      *(undefined1 *)num_local = 0;
      return CURLE_OK;
    }
    do {
      r = 0;
      CVar1 = randit((Curl_easy *)rnd_local,local_34);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
    } while (0xfffffffb < local_34[0]);
    *(char *)num_local =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789"[(ulong)local_34[0] % 0x3e]
    ;
    _alnumspace = _alnumspace + -1;
    num_local = num_local + 1;
  } while( true );
}

Assistant:

CURLcode Curl_rand_alnum(struct Curl_easy *data, unsigned char *rnd,
                         size_t num)
{
  CURLcode result = CURLE_OK;
  const int alnumspace = sizeof(alnum) - 1;
  unsigned int r;
  DEBUGASSERT(num > 1);

  num--; /* save one for null-termination */

  while(num) {
    do {
      result = randit(data, &r);
      if(result)
        return result;
    } while(r >= (UINT_MAX - UINT_MAX % alnumspace));

    *rnd++ = alnum[r % alnumspace];
    num--;
  }
  *rnd = 0;

  return result;
}